

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O2

void __thiscall HttpData::seperateTimer(HttpData *this)

{
  element_type *peVar1;
  weak_ptr<TimerNode> *this_00;
  shared_ptr<TimerNode> my_timer;
  __shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  this_00 = &this->timer_;
  std::__shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_20,this_00);
  peVar1 = local_20._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  if (peVar1 != (TimerNode *)0x0) {
    std::__shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_20,this_00);
    TimerNode::clearReq(local_20._M_ptr);
    std::__weak_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>::reset
              (&this_00->super___weak_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  }
  return;
}

Assistant:

void HttpData::seperateTimer() {
  // cout << "seperateTimer" << endl;
  if (timer_.lock()) {
    shared_ptr<TimerNode> my_timer(timer_.lock());
    my_timer->clearReq();
    timer_.reset();
  }
}